

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O0

bool __thiscall
Rml::ConvolutionFilter::Initialise
          (ConvolutionFilter *this,Vector2i _kernel_radii,FilterOperation _operation)

{
  undefined1 auVar1 [16];
  code *pcVar2;
  bool bVar3;
  ulong __n;
  float *__p;
  unique_ptr<float[],_std::default_delete<float[]>_> local_48;
  Vector2<int> local_3c;
  Vector2<int> local_34;
  Vector2<int> local_2c;
  FilterOperation local_24;
  ConvolutionFilter *pCStack_20;
  FilterOperation _operation_local;
  ConvolutionFilter *this_local;
  Vector2i _kernel_radii_local;
  
  this_local._4_4_ = _kernel_radii.x;
  local_24 = _operation;
  pCStack_20 = this;
  unique0x100001a9 = _kernel_radii;
  if ((this_local._4_4_ < 0) || ((long)_kernel_radii < 0)) {
    bVar3 = Assert("Invalid input parameters to convolution filter.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ConvolutionFilter.cpp"
                   ,0x31);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    _kernel_radii_local.x._3_1_ = false;
  }
  else {
    local_34 = Vector2<int>::operator*((Vector2<int> *)((long)&this_local + 4),2);
    Vector2<int>::Vector2(&local_3c,1);
    local_2c = Vector2<int>::operator+(&local_34,local_3c);
    (this->kernel_size).x = local_2c.x;
    (this->kernel_size).y = local_2c.y;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)((this->kernel_size).x * (this->kernel_size).y);
    __n = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      __n = 0xffffffffffffffff;
    }
    __p = (float *)operator_new__(__n);
    memset(__p,0,__n);
    ::std::unique_ptr<float[],std::default_delete<float[]>>::
    unique_ptr<float*,std::default_delete<float[]>,void,bool>
              ((unique_ptr<float[],std::default_delete<float[]>> *)&local_48,__p);
    ::std::unique_ptr<float[],_std::default_delete<float[]>_>::operator=(&this->kernel,&local_48);
    ::std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_48);
    this->operation = local_24;
    _kernel_radii_local.x._3_1_ = true;
  }
  return _kernel_radii_local.x._3_1_;
}

Assistant:

bool ConvolutionFilter::Initialise(Vector2i _kernel_radii, FilterOperation _operation)
{
	if (_kernel_radii.x < 0 || _kernel_radii.y < 0)
	{
		RMLUI_ERRORMSG("Invalid input parameters to convolution filter.");
		return false;
	}

	kernel_size = _kernel_radii * 2 + Vector2i(1);

	kernel = UniquePtr<float[]>(new float[kernel_size.x * kernel_size.y]());

	operation = _operation;
	return true;
}